

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

target_ulong helper_get_dr_x86_64(CPUX86State *env,int reg)

{
  uintptr_t unaff_retaddr;
  int reg_local;
  CPUX86State *env_local;
  
  if ((uint)reg < 4) {
LAB_00512d7d:
    return env->dr[reg];
  }
  if (reg == 4) {
    if ((env->cr[4] & 8) == 0) {
      return env->dr[6];
    }
  }
  else if (reg == 5) {
    if ((env->cr[4] & 8) == 0) {
      return env->dr[7];
    }
  }
  else if (reg == 6 || reg == 7) goto LAB_00512d7d;
  raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
}

Assistant:

target_ulong helper_get_dr(CPUX86State *env, int reg)
{
    switch (reg) {
    case 0: case 1: case 2: case 3: case 6: case 7:
        return env->dr[reg];
    case 4:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        } else {
            return env->dr[6];
        }
    case 5:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        } else {
            return env->dr[7];
        }
    }
    raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
}